

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O0

TPZElementMatrix * __thiscall
TPZStack<TPZElementMatrix_*,_10>::Pop(TPZStack<TPZElementMatrix_*,_10> *this)

{
  ostream *this_00;
  long in_RDI;
  TPZElementMatrix *temp;
  TPZElementMatrix *local_8;
  
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
  if (*(long *)(in_RDI + 0x10) < 0) {
    *(undefined8 *)(in_RDI + 0x10) = 0;
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZStack popping beyond the stack object");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
    local_8 = (TPZElementMatrix *)0x0;
  }
  else {
    local_8 = *(TPZElementMatrix **)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10) * 8);
  }
  return local_8;
}

Assistant:

T TPZStack<T, NumExtAlloc>::Pop() {
	this->fNElements--;
	if(this->fNElements <0){
		this->fNElements = 0;
		PZError << "TPZStack popping beyond the stack object" << std::endl;
		PZError.flush();
		T temp(0);
		return temp;
	}
	return this->fStore[this->fNElements];
}